

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

Mat * ncnn::Mat::from_pixels_resize
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                int target_width,int target_height,Allocator *allocator)

{
  int *piVar1;
  Mat local_78;
  
  if (h == target_height && w == target_width) {
    from_pixels(__return_storage_ptr__,pixels,type,w,h,stride,allocator);
    return __return_storage_ptr__;
  }
  if ((type & 0xffffU) - 1 < 2) {
    local_78.cstep = 0;
    local_78.data = (uchar *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    create(&local_78,target_width,target_height,3,3,(Allocator *)0x0);
    resize_bilinear_c3(pixels,w,h,stride,(uchar *)local_78.data,target_width,target_height,
                       target_width * 3);
    from_pixels(__return_storage_ptr__,(uchar *)local_78.data,type,target_width,target_height,
                allocator);
    piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return __return_storage_ptr__;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return __return_storage_ptr__;
    }
  }
  else if ((type & 0xffffU) == 3) {
    local_78.cstep = 0;
    local_78.data = (uchar *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    create(&local_78,target_width,target_height,1,1,(Allocator *)0x0);
    resize_bilinear_c1(pixels,w,h,stride,(uchar *)local_78.data,target_width,target_height,
                       target_width);
    from_pixels(__return_storage_ptr__,(uchar *)local_78.data,type,target_width,target_height,
                allocator);
    piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return __return_storage_ptr__;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return __return_storage_ptr__;
    }
  }
  else {
    if ((type & 0xfffeU) != 4) {
      fprintf(_stderr,"unknown convert type %d",(ulong)(uint)type);
      fputc(10,_stderr);
      __return_storage_ptr__->cstep = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->d = 0;
      __return_storage_ptr__->c = 0;
      return __return_storage_ptr__;
    }
    local_78.cstep = 0;
    local_78.data = (uchar *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    create(&local_78,target_width,target_height,4,4,(Allocator *)0x0);
    resize_bilinear_c4(pixels,w,h,stride,(uchar *)local_78.data,target_width,target_height,
                       target_width * 4);
    from_pixels(__return_storage_ptr__,(uchar *)local_78.data,type,target_width,target_height,
                allocator);
    piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return __return_storage_ptr__;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return __return_storage_ptr__;
    }
  }
  free(local_78.data);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}